

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

void __thiscall
ROM::Request::Node::visit
          (Node *this,function<void_(ROM::Request::ListType,_unsigned_long)> *enter_list,
          function<void_()> *exit_list,
          function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
          *add_item)

{
  Type TVar1;
  pointer pNVar2;
  long lVar3;
  long lVar4;
  size_t index;
  ulong uVar5;
  Description local_c8;
  
  TVar1 = this->type;
  if (TVar1 < One) {
    std::function<void_(ROM::Request::ListType,_unsigned_long)>::operator()
              (enter_list,(uint)(TVar1 != Any),
               ((long)(this->children).
                      super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->children).
                     super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x28);
    lVar3 = -1;
    lVar4 = 0;
    for (uVar5 = 0;
        pNVar2 = (this->children).
                 super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl
                 .super__Vector_impl_data._M_start,
        uVar5 < (ulong)(((long)(this->children).
                               super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) / 0x28);
        uVar5 = uVar5 + 1) {
      if (*(int *)((long)&pNVar2->type + lVar4) == 2) {
        Description::Description(&local_c8,*(Name *)((long)&pNVar2->name + lVar4));
        std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>
        ::operator()(add_item,(uint)(TVar1 != Any),&local_c8,(&pNVar2->is_optional)[lVar4],
                     ((long)(this->children).
                            super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->children).
                           super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28 + lVar3);
        Description::~Description(&local_c8);
      }
      else {
        visit((Node *)((long)&pNVar2->type + lVar4),enter_list,exit_list,add_item);
      }
      lVar4 = lVar4 + 0x28;
      lVar3 = lVar3 + -1;
    }
  }
  else {
    if (TVar1 != One) {
      return;
    }
    std::function<void_(ROM::Request::ListType,_unsigned_long)>::operator()(enter_list,Single,1);
    Description::Description(&local_c8,this->name);
    std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>::
    operator()(add_item,Any,&local_c8,this->is_optional,0);
    Description::~Description(&local_c8);
  }
  std::function<void_()>::operator()(exit_list);
  return;
}

Assistant:

void Request::Node::visit(
	const std::function<void(ListType, size_t)> &enter_list,
	const std::function<void(void)> &exit_list,
	const std::function<void(ROM::Request::ListType type, const ROM::Description &, bool is_optional, size_t remaining)> &add_item
) const {
	switch(type) {
		case Type::One:
			enter_list(ListType::Single, 1);
			add_item(ROM::Request::ListType::Any, Description(name), is_optional, 0);
			exit_list();
		break;

		case Type::Any:
		case Type::All: {
			const ListType list_type = type == Type::Any ? ListType::Any : ListType::All;
			enter_list(list_type, children.size());
			for(size_t index = 0; index < children.size(); index++) {
				auto &child = children[index];

				if(child.type == Type::One) {
					add_item(list_type, Description(child.name), child.is_optional, children.size() - 1 - index);
				} else {
					child.visit(enter_list, exit_list, add_item);
				}
			}
			exit_list();
		} break;
	}
}